

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O3

void test_archive_string_update_utf8_koi8(void)

{
  wchar_t wVar1;
  char *pcVar2;
  archive_mstring mstr;
  
  mstr.aes_mbs_in_locale.length = 0;
  mstr.aes_mbs_in_locale.buffer_length = 0;
  mstr.aes_wcs.buffer_length = 0;
  mstr.aes_mbs_in_locale.s = (char *)0x0;
  mstr.aes_wcs.s = (wchar_t *)0x0;
  mstr.aes_wcs.length = 0;
  mstr.aes_utf8.length = 0;
  mstr.aes_utf8.buffer_length = 0;
  mstr.aes_mbs.buffer_length = 0;
  mstr.aes_utf8.s = (char *)0x0;
  mstr.aes_mbs.s = (char *)0x0;
  mstr.aes_mbs.length = 0;
  mstr.aes_set = L'\0';
  mstr._100_4_ = 0;
  pcVar2 = setlocale(6,"ru_RU.KOI8-R");
  if (pcVar2 != (char *)0x0) {
    wVar1 = archive_mstring_update_utf8
                      ((archive_conflict *)0x0,&mstr,
                       test_archive_string_update_utf8_koi8::utf8_string);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,L'Ϯ',0,"0",(long)wVar1,"r",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,L'ϯ',7,"AES_SET_MBS | AES_SET_WCS | AES_SET_UTF8",(long)mstr.aes_set,
                        "mstr.aes_set",(void *)0x0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
               ,L'ϰ',test_archive_string_update_utf8_koi8::utf8_string,"utf8_string",
               mstr.aes_utf8.s,"mstr.aes_utf8.s",(void *)0x0,L'\0');
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
               ,L'ϱ',test_archive_string_update_utf8_koi8::koi8_string,"koi8_string",mstr.aes_mbs.s
               ,"mstr.aes_mbs.s",(void *)0x0,L'\0');
    archive_mstring_clean(&mstr);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                 ,L'ϧ');
  test_skipping("KOI8-R locale not available on this system.");
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_update_utf8_koi8)
{
	static const char utf8_string[] = "\xD0\xBF\xD1\x80\xD0\xB8";
	static const char koi8_string[] = "\xD0\xD2\xC9";
	static const wchar_t wcs_string[] = L"\U0000043f\U00000440\U00000438";
	struct archive_mstring mstr;
	int r;

	memset(&mstr, 0, sizeof(mstr));

	if (setlocale(LC_ALL, "ru_RU.KOI8-R") == NULL) {
		skipping("KOI8-R locale not available on this system.");
		return;
	}

	r = archive_mstring_update_utf8(NULL, &mstr, utf8_string);

	/* All conversions should have succeeded */
	assertEqualInt(0, r);
	assertEqualInt(AES_SET_MBS | AES_SET_WCS | AES_SET_UTF8, mstr.aes_set);
	assertEqualString(utf8_string, mstr.aes_utf8.s);
	assertEqualString(koi8_string, mstr.aes_mbs.s);
#if defined(_WIN32) && !defined(__CYGWIN__)
	assertEqualWString(wcs_string, mstr.aes_wcs.s);
#else
	/* No guarantee of how WCS strings behave, however this test test is
	 * primarily meant for Windows */
	(void)wcs_string;
#endif

	archive_mstring_clean(&mstr);
}